

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::BroadcastBool(bool *bBool,int myLocalId,int rootId,MPI_Comm *localComm)

{
  MPI_Comm *in_RCX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int numBool;
  uint local_1c [3];
  int local_10;
  int local_c;
  byte *local_8;
  
  local_1c[0] = 0;
  if (in_ESI == in_EDX) {
    local_1c[0] = (uint)(*in_RDI & 1);
  }
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  ParallelDescriptor::Bcast<int>((int *)local_1c,1,in_EDX,in_RCX);
  if (local_c != local_10) {
    *local_8 = local_1c[0] != 0;
  }
  return;
}

Assistant:

void amrex::BroadcastBool(bool &bBool, int myLocalId, int rootId, const MPI_Comm &localComm)
{
  int numBool = 0;
  if (myLocalId == rootId) {
    numBool = bBool;
  }

  amrex::ParallelDescriptor::Bcast(&numBool, 1, rootId, localComm);

  if(myLocalId != rootId) {
    bBool = numBool;
  }
}